

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxReEnter(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *sel,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *maxabs,SPxId *id,int nr,bool polish)

{
  uint *puVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar3;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *w;
  undefined8 uVar4;
  type_conflict5 tVar5;
  bool bVar6;
  int iVar7;
  cpp_dec_float<50U,_int,_void> *v;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar8;
  pointer pnVar9;
  cpp_dec_float<50U,_int,_void> *u;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_00;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar10;
  long lVar11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  bool local_169;
  int32_t local_168;
  fpclass_type local_164;
  int local_160;
  cpp_dec_float<50U,_int,_void> local_148;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_110;
  long local_108;
  cpp_dec_float<50U,_int,_void> *local_100;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f0;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_148.data._M_elems._32_5_ = 0;
  local_148.data._M_elems[9]._1_3_ = 0;
  local_148.exp = 0;
  local_148.neg = false;
  local_148.data._M_elems[4] = 0;
  local_148.data._M_elems[5] = 0;
  local_148.data._M_elems._24_5_ = 0;
  local_148.data._M_elems[7]._1_3_ = 0;
  local_148.data._M_elems[0] = 0;
  local_148.data._M_elems[1] = 0;
  local_148.data._M_elems[2] = 0;
  local_148.data._M_elems[3] = 0;
  local_68.fpclass = cpp_dec_float_finite;
  local_68.prec_elem = 10;
  local_68.data._M_elems[0] = 0;
  local_68.data._M_elems[1] = 0;
  local_68.data._M_elems[2] = 0;
  local_68.data._M_elems[3] = 0;
  local_68.data._M_elems[4] = 0;
  local_68.data._M_elems[5] = 0;
  local_68.data._M_elems._24_5_ = 0;
  local_68.data._M_elems[7]._1_3_ = 0;
  local_68.data._M_elems._32_5_ = 0;
  local_68.data._M_elems[9]._1_3_ = 0;
  local_68.exp = 0;
  local_68.neg = false;
  pSVar2 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pUVar3 = pSVar2->thePvec;
  w = pSVar2->theCoPvec;
  iVar7 = (id->super_DataKey).info * pSVar2->theRep;
  local_100 = &maxabs->m_backend;
  if (iVar7 < 0) {
    lVar11 = (long)nr;
    if (0 < pSVar2->theRep *
            ((pSVar2->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.costat)->data[lVar11]) {
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clearIdx(&w->thedelta,nr);
      return true;
    }
    pVVar8 = pSVar2->theCoUbound;
    pVVar10 = pSVar2->theCoLbound;
    pnVar9 = (w->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = *(undefined8 *)((long)&pnVar9[lVar11].m_backend.data + 0x20);
    local_148.data._M_elems._32_5_ = SUB85(uVar4,0);
    local_148.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
    local_148.data._M_elems._0_8_ = *(undefined8 *)&pnVar9[lVar11].m_backend.data;
    local_148.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar9[lVar11].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar9[lVar11].m_backend.data + 0x10);
    local_148.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar4 = *(undefined8 *)(puVar1 + 2);
    local_148.data._M_elems._24_5_ = SUB85(uVar4,0);
    local_148.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
    local_160 = pnVar9[lVar11].m_backend.exp;
    local_169 = pnVar9[lVar11].m_backend.neg;
    local_164 = pnVar9[lVar11].m_backend.fpclass;
    local_168 = pnVar9[lVar11].m_backend.prec_elem;
    local_148.exp = local_160;
    local_148.neg = local_169;
    local_148.fpclass = local_164;
    local_148.prec_elem = local_168;
    local_108 = lVar11;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_a8,&w->thedelta,nr);
    local_68.data._M_elems[4] = local_a8.data._M_elems[4];
    local_68.data._M_elems[5] = local_a8.data._M_elems[5];
    local_68.data._M_elems[0] = local_a8.data._M_elems[0];
    local_68.data._M_elems[1] = local_a8.data._M_elems[1];
    local_68.data._M_elems[2] = local_a8.data._M_elems[2];
    local_68.data._M_elems[3] = local_a8.data._M_elems[3];
    local_68.exp = local_a8.exp;
    local_68.neg = local_a8.neg;
    local_68.fpclass = local_a8.fpclass;
    local_68.prec_elem = local_a8.prec_elem;
    local_a8.data._M_elems._0_8_ = 0.0;
    tVar5 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_68,(double *)&local_a8);
    if (tVar5) {
      pnVar9 = (pVVar10->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      pnVar9 = (pVVar8->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    local_e8.fpclass = cpp_dec_float_finite;
    local_e8.prec_elem = 10;
    local_e8.data._M_elems[0] = 0;
    local_e8.data._M_elems[1] = 0;
    local_e8.data._M_elems[2] = 0;
    local_e8.data._M_elems[3] = 0;
    local_e8.data._M_elems[4] = 0;
    local_e8.data._M_elems[5] = 0;
    local_e8.data._M_elems._24_5_ = 0;
    local_e8.data._M_elems[7]._1_3_ = 0;
    local_e8.data._M_elems._32_5_ = 0;
    local_e8.data._M_elems[9]._1_3_ = 0;
    local_e8.exp = 0;
    local_e8.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_e8,&pnVar9[lVar11].m_backend,
               &(w->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend);
    local_a8.fpclass = cpp_dec_float_finite;
    local_a8.prec_elem = 10;
    local_a8.data._M_elems._0_8_ = 0.0;
    local_a8.data._M_elems[2] = 0;
    local_a8.data._M_elems[3] = 0;
    local_a8.data._M_elems[4] = 0;
    local_a8.data._M_elems[5] = 0;
    local_a8.data._M_elems._24_5_ = 0;
    local_a8.data._M_elems[7]._1_3_ = 0;
    local_a8.data._M_elems._32_5_ = 0;
    local_a8.data._M_elems[9]._1_3_ = 0;
    local_a8.exp = 0;
    local_a8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_a8,&local_e8,&local_68);
    *(ulong *)((sel->m_backend).data._M_elems + 8) =
         CONCAT35(local_a8.data._M_elems[9]._1_3_,local_a8.data._M_elems._32_5_);
    *(undefined8 *)((sel->m_backend).data._M_elems + 4) = local_a8.data._M_elems._16_8_;
    *(ulong *)((sel->m_backend).data._M_elems + 6) =
         CONCAT35(local_a8.data._M_elems[7]._1_3_,local_a8.data._M_elems._24_5_);
    *(undefined8 *)(sel->m_backend).data._M_elems = local_a8.data._M_elems._0_8_;
    *(undefined8 *)((sel->m_backend).data._M_elems + 2) = local_a8.data._M_elems._8_8_;
    (sel->m_backend).exp = local_a8.exp;
    (sel->m_backend).neg = local_a8.neg;
    (sel->m_backend).fpclass = local_a8.fpclass;
    (sel->m_backend).prec_elem = local_a8.prec_elem;
  }
  else {
    if (iVar7 == 0) {
      return true;
    }
    local_f0 = pSVar2->theUbound;
    pVVar10 = pSVar2->theLbound;
    lVar11 = (long)nr;
    local_110 = this;
    local_f8 = &pUVar3->thedelta;
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator*((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_a8,
                (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((pSVar2->thevectors->set).theitem + (pSVar2->thevectors->set).thekey[lVar11].idx
                   ),&w->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               );
    pVVar8 = local_f0;
    pnVar9 = (pUVar3->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(ulong *)((long)(pnVar9 + lVar11) + 0x20) =
         CONCAT35(local_a8.data._M_elems[9]._1_3_,local_a8.data._M_elems._32_5_);
    *(undefined8 *)((long)(pnVar9 + lVar11) + 0x10) = local_a8.data._M_elems._16_8_;
    *(ulong *)((long)(pnVar9 + lVar11) + 0x18) =
         CONCAT35(local_a8.data._M_elems[7]._1_3_,local_a8.data._M_elems._24_5_);
    *(undefined8 *)&pnVar9[lVar11].m_backend = local_a8.data._M_elems._0_8_;
    *(undefined8 *)((long)&pnVar9[lVar11].m_backend + 8) = local_a8.data._M_elems._8_8_;
    *(int *)((long)(pnVar9 + lVar11) + 0x28) = local_a8.exp;
    *(bool *)((long)(pnVar9 + lVar11) + 0x2c) = local_a8.neg;
    *(undefined8 *)((long)(pnVar9 + lVar11) + 0x30) = local_a8._48_8_;
    pSVar2 = (local_110->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    if (0 < pSVar2->theRep *
            ((pSVar2->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.stat)->data[lVar11]) {
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clearIdx(local_f8,nr);
      return true;
    }
    pnVar9 = (pUVar3->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_148.data._M_elems._32_5_ = SUB85(*(undefined8 *)((long)(pnVar9 + lVar11) + 0x20),0);
    local_148.data._M_elems[9]._1_3_ =
         (undefined3)((ulong)*(undefined8 *)((long)(pnVar9 + lVar11) + 0x20) >> 0x28);
    local_148.data._M_elems._0_8_ = *(undefined8 *)&pnVar9[lVar11].m_backend;
    local_148.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar9[lVar11].m_backend + 8);
    local_148.data._M_elems._16_8_ = *(undefined8 *)((long)(pnVar9 + lVar11) + 0x10);
    uVar4 = *(undefined8 *)((long)(pnVar9 + lVar11) + 0x18);
    local_148.data._M_elems._24_5_ = SUB85(uVar4,0);
    local_148.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
    local_160 = *(int *)((long)(pnVar9 + lVar11) + 0x28);
    local_169 = *(bool *)((long)(pnVar9 + lVar11) + 0x2c);
    local_164 = *(fpclass_type *)((long)(pnVar9 + lVar11) + 0x30);
    local_168 = *(int32_t *)((long)(pnVar9 + lVar11) + 0x34);
    local_148.exp = local_160;
    local_148.neg = local_169;
    local_148.fpclass = local_164;
    local_148.prec_elem = local_168;
    local_108 = lVar11;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_a8,local_f8,nr);
    local_68.data._M_elems[4] = local_a8.data._M_elems[4];
    local_68.data._M_elems[5] = local_a8.data._M_elems[5];
    local_68.data._M_elems[0] = local_a8.data._M_elems[0];
    local_68.data._M_elems[1] = local_a8.data._M_elems[1];
    local_68.data._M_elems[2] = local_a8.data._M_elems[2];
    local_68.data._M_elems[3] = local_a8.data._M_elems[3];
    local_68.exp = local_a8.exp;
    local_68.neg = local_a8.neg;
    local_68.fpclass = local_a8.fpclass;
    local_68.prec_elem = local_a8.prec_elem;
    local_a8.data._M_elems._0_8_ = 0.0;
    tVar5 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_68,(double *)&local_a8);
    if (tVar5) {
      local_e8.fpclass = cpp_dec_float_finite;
      local_e8.prec_elem = 10;
      local_e8.data._M_elems[0] = 0;
      local_e8.data._M_elems[1] = 0;
      local_e8.data._M_elems[2] = 0;
      local_e8.data._M_elems[3] = 0;
      local_e8.data._M_elems[4] = 0;
      local_e8.data._M_elems[5] = 0;
      local_e8.data._M_elems._24_5_ = 0;
      local_e8.data._M_elems[7]._1_3_ = 0;
      local_e8.data._M_elems._32_5_ = 0;
      local_e8.data._M_elems[9]._1_3_ = 0;
      local_e8.exp = 0;
      local_e8.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_e8,
                 &(pVVar10->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend,
                 &(pUVar3->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend);
      local_a8.fpclass = cpp_dec_float_finite;
      local_a8.prec_elem = 10;
      local_a8.data._M_elems._0_8_ = 0.0;
      local_a8.data._M_elems[2] = 0;
      local_a8.data._M_elems[3] = 0;
      local_a8.data._M_elems[4] = 0;
      local_a8.data._M_elems[5] = 0;
      local_a8.data._M_elems._24_5_ = 0;
      local_a8.data._M_elems[7]._1_3_ = 0;
      local_a8.data._M_elems._32_5_ = 0;
      local_a8.data._M_elems[9]._1_3_ = 0;
      local_a8.exp = 0;
      local_a8.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_a8,&local_e8,&local_68);
      *(ulong *)((sel->m_backend).data._M_elems + 8) =
           CONCAT35(local_a8.data._M_elems[9]._1_3_,local_a8.data._M_elems._32_5_);
      *(undefined8 *)((sel->m_backend).data._M_elems + 4) = local_a8.data._M_elems._16_8_;
      *(ulong *)((sel->m_backend).data._M_elems + 6) =
           CONCAT35(local_a8.data._M_elems[7]._1_3_,local_a8.data._M_elems._24_5_);
      *(undefined8 *)(sel->m_backend).data._M_elems = local_a8.data._M_elems._0_8_;
      *(undefined8 *)((sel->m_backend).data._M_elems + 2) = local_a8.data._M_elems._8_8_;
      (sel->m_backend).exp = local_a8.exp;
      (sel->m_backend).neg = local_a8.neg;
      (sel->m_backend).fpclass = local_a8.fpclass;
      (sel->m_backend).prec_elem = local_a8.prec_elem;
      this = local_110;
    }
    else {
      local_e8.fpclass = cpp_dec_float_finite;
      local_e8.prec_elem = 10;
      local_e8.data._M_elems[0] = 0;
      local_e8.data._M_elems[1] = 0;
      local_e8.data._M_elems[2] = 0;
      local_e8.data._M_elems[3] = 0;
      local_e8.data._M_elems[4] = 0;
      local_e8.data._M_elems[5] = 0;
      local_e8.data._M_elems._24_5_ = 0;
      local_e8.data._M_elems[7]._1_3_ = 0;
      local_e8.data._M_elems._32_5_ = 0;
      local_e8.data._M_elems[9]._1_3_ = 0;
      local_e8.exp = 0;
      local_e8.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_e8,
                 &(pVVar8->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend,
                 &(pUVar3->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend);
      local_a8.fpclass = cpp_dec_float_finite;
      local_a8.prec_elem = 10;
      local_a8.data._M_elems._0_8_ = 0.0;
      local_a8.data._M_elems[2] = 0;
      local_a8.data._M_elems[3] = 0;
      local_a8.data._M_elems[4] = 0;
      local_a8.data._M_elems[5] = 0;
      local_a8.data._M_elems._24_5_ = 0;
      local_a8.data._M_elems[7]._1_3_ = 0;
      local_a8.data._M_elems._32_5_ = 0;
      local_a8.data._M_elems[9]._1_3_ = 0;
      local_a8.exp = 0;
      local_a8.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_a8,&local_e8,&local_68);
      *(ulong *)((sel->m_backend).data._M_elems + 8) =
           CONCAT35(local_a8.data._M_elems[9]._1_3_,local_a8.data._M_elems._32_5_);
      *(undefined8 *)((sel->m_backend).data._M_elems + 4) = local_a8.data._M_elems._16_8_;
      *(ulong *)((sel->m_backend).data._M_elems + 6) =
           CONCAT35(local_a8.data._M_elems[7]._1_3_,local_a8.data._M_elems._24_5_);
      *(undefined8 *)(sel->m_backend).data._M_elems = local_a8.data._M_elems._0_8_;
      *(undefined8 *)((sel->m_backend).data._M_elems + 2) = local_a8.data._M_elems._8_8_;
      (sel->m_backend).exp = local_a8.exp;
      (sel->m_backend).neg = local_a8.neg;
      (sel->m_backend).fpclass = local_a8.fpclass;
      (sel->m_backend).prec_elem = local_a8.prec_elem;
      this = local_110;
    }
  }
  lVar11 = local_108;
  bVar6 = boost::multiprecision::operator!=
                    ((pVVar8->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + local_108,
                     (pVVar10->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + local_108);
  if (bVar6) {
    uVar4 = *(undefined8 *)((this->fastDelta).m_backend.data._M_elems + 8);
    local_e8.data._M_elems._32_5_ = SUB85(uVar4,0);
    local_e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
    local_e8.data._M_elems._0_8_ = *(undefined8 *)(this->fastDelta).m_backend.data._M_elems;
    local_e8.data._M_elems._8_8_ = *(undefined8 *)((this->fastDelta).m_backend.data._M_elems + 2);
    local_e8.data._M_elems._16_8_ = *(undefined8 *)((this->fastDelta).m_backend.data._M_elems + 4);
    uVar4 = *(undefined8 *)((this->fastDelta).m_backend.data._M_elems + 6);
    local_e8.data._M_elems._24_5_ = SUB85(uVar4,0);
    local_e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
    local_e8.exp = (this->fastDelta).m_backend.exp;
    local_e8.neg = (this->fastDelta).m_backend.neg;
    local_e8.fpclass = (this->fastDelta).m_backend.fpclass;
    local_e8.prec_elem = (this->fastDelta).m_backend.prec_elem;
    if (local_e8.fpclass != cpp_dec_float_finite || local_e8.data._M_elems[0] != 0) {
      local_e8.neg = (bool)(local_e8.neg ^ 1);
    }
    local_a8.fpclass = cpp_dec_float_finite;
    local_a8.prec_elem = 10;
    local_a8.data._M_elems._0_8_ = 0.0;
    local_a8.data._M_elems[2] = 0;
    local_a8.data._M_elems[3] = 0;
    local_a8.data._M_elems[4] = 0;
    local_a8.data._M_elems[5] = 0;
    local_a8.data._M_elems._24_5_ = 0;
    local_a8.data._M_elems[7]._1_3_ = 0;
    local_a8.data._M_elems._32_5_ = 0;
    local_a8.data._M_elems[9]._1_3_ = 0;
    local_a8.exp = 0;
    local_a8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_a8,&local_e8,local_100);
    tVar5 = boost::multiprecision::operator<
                      (sel,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_a8);
    if ((tVar5) &&
       (boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)sel,0.0), !polish)) {
      local_a8.data._M_elems._0_8_ = 0.0;
      tVar5 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_68,(double *)&local_a8);
      this_00 = &((this->
                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thesolver)->theShift;
      if (tVar5) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&this_00->m_backend,
                   &(pVVar8->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend);
        pnVar9 = (pVVar8->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)&pnVar9[lVar11].m_backend.data = local_148.data._M_elems._0_8_;
        *(undefined8 *)((long)&pnVar9[lVar11].m_backend.data + 8) = local_148.data._M_elems._8_8_;
        puVar1 = (uint *)((long)&pnVar9[lVar11].m_backend.data + 0x10);
        *(undefined8 *)puVar1 = local_148.data._M_elems._16_8_;
        *(ulong *)(puVar1 + 2) =
             CONCAT35(local_148.data._M_elems[7]._1_3_,local_148.data._M_elems._24_5_);
        *(ulong *)((long)&pnVar9[lVar11].m_backend.data + 0x20) =
             CONCAT35(local_148.data._M_elems[9]._1_3_,local_148.data._M_elems._32_5_);
        pnVar9[lVar11].m_backend.exp = local_160;
        pnVar9[lVar11].m_backend.neg = local_169;
        pnVar9[lVar11].m_backend.fpclass = local_164;
        pnVar9[lVar11].m_backend.prec_elem = local_168;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&(((this->
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thesolver)->theShift).m_backend,
                   &(pVVar8->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend);
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&this_00->m_backend,
                   &(pVVar10->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend);
        pnVar9 = (pVVar10->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)&pnVar9[lVar11].m_backend.data = local_148.data._M_elems._0_8_;
        *(undefined8 *)((long)&pnVar9[lVar11].m_backend.data + 8) = local_148.data._M_elems._8_8_;
        puVar1 = (uint *)((long)&pnVar9[lVar11].m_backend.data + 0x10);
        *(undefined8 *)puVar1 = local_148.data._M_elems._16_8_;
        *(ulong *)(puVar1 + 2) =
             CONCAT35(local_148.data._M_elems[7]._1_3_,local_148.data._M_elems._24_5_);
        *(ulong *)((long)&pnVar9[lVar11].m_backend.data + 0x20) =
             CONCAT35(local_148.data._M_elems[9]._1_3_,local_148.data._M_elems._32_5_);
        pnVar9[lVar11].m_backend.exp = local_160;
        pnVar9[lVar11].m_backend.neg = local_169;
        pnVar9[lVar11].m_backend.fpclass = local_164;
        pnVar9[lVar11].m_backend.prec_elem = local_168;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&(((this->
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thesolver)->theShift).m_backend,
                   &(pVVar10->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend);
      }
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)sel,0.0);
    if (!polish) {
      tVar5 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_148,
                         (pVVar8->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar11);
      if (tVar5) {
        v = &(pVVar8->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend;
        u = &local_148;
      }
      else {
        u = &(pVVar10->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend;
        v = &local_148;
      }
      local_a8.fpclass = cpp_dec_float_finite;
      local_a8.prec_elem = 10;
      local_a8.neg = false;
      local_a8.exp = 0;
      local_a8.data._M_elems[9]._1_3_ = 0;
      local_a8.data._M_elems._32_5_ = 0;
      local_a8.data._M_elems[7]._1_3_ = 0;
      local_a8.data._M_elems._24_5_ = 0;
      local_a8.data._M_elems[4] = 0;
      local_a8.data._M_elems[5] = 0;
      local_a8.data._M_elems[2] = 0;
      local_a8.data._M_elems[3] = 0;
      local_a8.data._M_elems._0_8_ = 0.0;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_a8,u,v);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&(((this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver)->theShift).m_backend,&local_a8);
      pnVar9 = (pVVar10->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)&pnVar9[lVar11].m_backend.data + 0x20) =
           CONCAT35(local_148.data._M_elems[9]._1_3_,local_148.data._M_elems._32_5_);
      puVar1 = (uint *)((long)&pnVar9[lVar11].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = local_148.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_148.data._M_elems[7]._1_3_,local_148.data._M_elems._24_5_);
      *(undefined8 *)&pnVar9[lVar11].m_backend.data = local_148.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar9[lVar11].m_backend.data + 8) = local_148.data._M_elems._8_8_;
      pnVar9[lVar11].m_backend.exp = local_148.exp;
      pnVar9[lVar11].m_backend.neg = local_148.neg;
      pnVar9[lVar11].m_backend.fpclass = local_148.fpclass;
      pnVar9[lVar11].m_backend.prec_elem = local_148.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&(pVVar8->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend,
                 &pnVar9[lVar11].m_backend);
    }
  }
  return false;
}

Assistant:

bool SPxFastRT<R>::maxReEnter(R& sel,
                              R maxabs,
                              const SPxId& id,
                              int nr,
                              bool polish)
{
   R x, d;
   VectorBase<R>* up;
   VectorBase<R>* low;

   UpdateVector<R>& pvec = this->thesolver->pVec();
   SSVectorBase<R>& pupd = this->thesolver->pVec().delta();
   VectorBase<R>& upb = this->thesolver->upBound();
   VectorBase<R>& lpb = this->thesolver->lpBound();
   UpdateVector<R>& cvec = this->thesolver->coPvec();
   SSVectorBase<R>& cupd = this->thesolver->coPvec().delta();
   VectorBase<R>& ucb = this->thesolver->ucBound();
   VectorBase<R>& lcb = this->thesolver->lcBound();

   if(this->thesolver->isCoId(id))
   {
      if(this->thesolver->isCoBasic(nr))
      {
         cupd.clearIdx(nr);
         return true;
      }

      x = cvec[nr];
      d = cupd[nr];
      up = &ucb;
      low = &lcb;

      if(d < 0.0)
         sel = (lcb[nr] - cvec[nr]) / d;
      else
         sel = (ucb[nr] - cvec[nr]) / d;
   }
   else if(this->thesolver->isId(id))
   {
      pvec[nr] = this->thesolver->vector(nr) * cvec;

      if(this->thesolver->isBasic(nr))
      {
         pupd.clearIdx(nr);
         return true;
      }

      x = pvec[nr];
      d = pupd[nr];
      up = &upb;
      low = &lpb;

      if(d < 0.0)
         sel = (lpb[nr] - pvec[nr]) / d;
      else
         sel = (upb[nr] - pvec[nr]) / d;
   }
   else
      return true;

   if((*up)[nr] != (*low)[nr])
   {
      if(sel < -fastDelta / maxabs)
      {
         sel = 0.0;

         // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
         if(!polish)
         {
            if(d > 0.0)
            {
               this->thesolver->theShift -= (*up)[nr];
               (*up)[nr] = x;
               this->thesolver->theShift += (*up)[nr];
            }
            else
            {
               this->thesolver->theShift += (*low)[nr];
               (*low)[nr] = x;
               this->thesolver->theShift -= (*low)[nr];
            }
         }
      }
   }
   else
   {
      sel = 0.0;

      // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
      if(!polish)
      {
         if(x > (*up)[nr])
            this->thesolver->theShift += x - (*up)[nr];
         else
            this->thesolver->theShift += (*low)[nr] - x;

         (*up)[nr] = (*low)[nr] = x;
      }
   }

   return false;
}